

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,uint size,int neg)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  pcVar2 = luaL_prepbuffsize(b,(ulong)size);
  uVar5 = 0;
  if (islittle == 0) {
    uVar5 = (ulong)(size - 1);
  }
  pcVar2[uVar5] = (char)n;
  if (1 < size) {
    uVar3 = size - 2;
    uVar4 = 1;
    do {
      uVar1 = uVar4;
      if (islittle == 0) {
        uVar1 = uVar3;
      }
      pcVar2[uVar1] = (char)(n >> 8);
      uVar4 = uVar4 + 1;
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
      n = n >> 8;
    } while (bVar6);
  }
  if (8 < size && neg != 0) {
    uVar4 = size - 9;
    uVar3 = 8;
    do {
      uVar1 = uVar3;
      if (islittle == 0) {
        uVar1 = uVar4;
      }
      pcVar2[uVar1] = -1;
      uVar3 = uVar3 + 1;
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
  }
  b->n = b->n + (ulong)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, unsigned size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  unsigned i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}